

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int Curl_hash_delete(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  size_t sVar3;
  Curl_hash_element *he;
  Curl_llist *l;
  Curl_llist_element *le;
  size_t key_len_local;
  void *key_local;
  Curl_hash *h_local;
  
  pCVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  l = (Curl_llist *)pCVar1[sVar2].head;
  while( true ) {
    if (l == (Curl_llist *)0x0) {
      return 1;
    }
    sVar3 = (*h->comp_func)(&l->head[1].next,(size_t)l->head[1].prev,key,key_len);
    if (sVar3 != 0) break;
    l = (Curl_llist *)l->dtor;
  }
  Curl_llist_remove(pCVar1 + sVar2,(Curl_llist_element *)l,h);
  h->size = h->size - 1;
  return 0;
}

Assistant:

int Curl_hash_delete(struct Curl_hash *h, void *key, size_t key_len)
{
  struct Curl_llist_element *le;
  struct Curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    struct Curl_hash_element *he = le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *) h);
      --h->size;
      return 0;
    }
  }
  return 1;
}